

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<BoolView>::copyTo(vec<BoolView> *this,vec<BoolView> *copy)

{
  BoolView *pBVar1;
  BoolView *pBVar2;
  ulong uVar3;
  long lVar4;
  
  if (copy->data != (BoolView *)0x0) {
    if (copy->sz != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        (**(code **)(*(long *)((long)&(copy->data->super_Var).super_Branching._vptr_Branching +
                              lVar4) + 0x28))
                  ((long)&(copy->data->super_Var).super_Branching._vptr_Branching + lVar4);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < copy->sz);
    }
    copy->sz = 0;
  }
  growTo(copy,this->sz);
  if (this->sz != 0) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      pBVar1 = copy->data;
      pBVar2 = this->data;
      *(undefined ***)((long)pBVar1 + lVar4 + -8) = &PTR_finished_0020bb98;
      *(undefined1 *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar4 + 4) =
           *(undefined1 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4 + 4);
      *(undefined4 *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar4) =
           *(undefined4 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < this->sz);
  }
  return;
}

Assistant:

void copyTo(vec<T>& copy) const {
		copy.clear();
		copy.growTo(sz);
		for (unsigned int i = 0; i < sz; i++) {
			new (&copy[i]) T(data[i]);
		}
	}